

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::QueryMemoryBySysconf(SystemInformationImplementation *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  size_t pagediv;
  long m;
  long p;
  SystemInformationImplementation *this_local;
  
  sVar2 = sysconf(0x55);
  lVar3 = sysconf(0x1e);
  if (((long)sVar2 < 0) || (lVar3 < 0)) {
    this_local._7_1_ = false;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x100000),8);
    uVar4 = SUB168((auVar1 << 0x40 | ZEXT816(0x100000)) / SEXT816(lVar3),0);
    this->TotalPhysicalMemory = sVar2;
    this->TotalPhysicalMemory = this->TotalPhysicalMemory / uVar4;
    sVar2 = sysconf(0x56);
    if ((long)sVar2 < 0) {
      this_local._7_1_ = false;
    }
    else {
      this->AvailablePhysicalMemory = sVar2;
      this->AvailablePhysicalMemory = this->AvailablePhysicalMemory / uVar4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::QueryMemoryBySysconf()
{
#if defined(_SC_PHYS_PAGES) && defined(_SC_PAGESIZE)
  // Assume the mmap() granularity as returned by _SC_PAGESIZE is also
  // the system page size. The only known system where this isn't true
  // is Cygwin.
  long p = sysconf(_SC_PHYS_PAGES);
  long m = sysconf(_SC_PAGESIZE);

  if (p < 0 || m < 0) {
    return false;
  }

  // assume pagesize is a power of 2 and smaller 1 MiB
  size_t pagediv = (1024 * 1024 / m);

  this->TotalPhysicalMemory = p;
  this->TotalPhysicalMemory /= pagediv;

#  if defined(_SC_AVPHYS_PAGES)
  p = sysconf(_SC_AVPHYS_PAGES);
  if (p < 0) {
    return false;
  }

  this->AvailablePhysicalMemory = p;
  this->AvailablePhysicalMemory /= pagediv;
#  endif

  return true;
#else
  return false;
#endif
}